

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::NeuralNetworkLayer::ByteSizeLong(NeuralNetworkLayer *this)

{
  int *piVar1;
  Rep **ppRVar2;
  float fVar3;
  byte bVar5;
  uint32 uVar6;
  size_type sVar7;
  int iVar8;
  uint uVar9;
  Type *pTVar10;
  Type *pTVar11;
  size_t sVar12;
  size_t sVar13;
  ConvolutionLayerParams *pCVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  int n;
  ulong uVar19;
  long lVar20;
  float fVar4;
  
  uVar15 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
  uVar19 = (ulong)uVar15;
  if (0 < (int)uVar15) {
    uVar18 = 0;
    do {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(this->input_).super_RepeatedPtrFieldBase,uVar18);
      uVar9 = (uint)pTVar10->_M_string_length | 1;
      iVar8 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      uVar19 = uVar19 + pTVar10->_M_string_length + (ulong)(iVar8 * 9 + 0x49U >> 6);
      uVar18 = uVar18 + 1;
    } while (uVar15 != uVar18);
  }
  uVar15 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
  lVar20 = uVar19 + uVar15;
  if (0 < (int)uVar15) {
    uVar18 = 0;
    do {
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(this->output_).super_RepeatedPtrFieldBase,uVar18);
      uVar9 = (uint)pTVar10->_M_string_length | 1;
      iVar8 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      lVar20 = lVar20 + pTVar10->_M_string_length + (ulong)(iVar8 * 9 + 0x49U >> 6);
      uVar18 = uVar18 + 1;
    } while (uVar15 != uVar18);
  }
  uVar15 = (this->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
  lVar20 = lVar20 + (ulong)uVar15;
  if ((ulong)uVar15 != 0) {
    uVar18 = 0;
    do {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                          (&(this->inputtensor_).super_RepeatedPtrFieldBase,uVar18);
      sVar12 = Tensor::ByteSizeLong(pTVar11);
      uVar9 = (uint)sVar12 | 1;
      iVar8 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      lVar20 = lVar20 + sVar12 + (ulong)(iVar8 * 9 + 0x49U >> 6);
      uVar18 = uVar18 + 1;
    } while (uVar15 != uVar18);
  }
  uVar15 = (this->outputtensor_).super_RepeatedPtrFieldBase.current_size_;
  sVar12 = lVar20 + (ulong)uVar15;
  if ((ulong)uVar15 != 0) {
    uVar18 = 0;
    do {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                          (&(this->outputtensor_).super_RepeatedPtrFieldBase,uVar18);
      sVar13 = Tensor::ByteSizeLong(pTVar11);
      uVar9 = (uint)sVar13 | 1;
      iVar8 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      sVar12 = sVar12 + sVar13 + (ulong)(iVar8 * 9 + 0x49U >> 6);
      uVar18 = uVar18 + 1;
    } while (uVar15 != uVar18);
  }
  sVar7 = ((this->name_).ptr_)->_M_string_length;
  if (sVar7 != 0) {
    uVar15 = (uint)sVar7 | 1;
    iVar8 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    sVar12 = sVar12 + sVar7 + (ulong)(iVar8 * 9 + 0x49U >> 6) + 1;
  }
  sVar13 = sVar12 + 2;
  if (this->isupdatable_ == false) {
    sVar13 = sVar12;
  }
  uVar6 = this->_oneof_case_[0];
  if ((int)uVar6 < 0x370) {
    if (0x25c < (int)uVar6) {
      if ((int)uVar6 < 0x2f8) {
        if ((int)uVar6 < 0x2ad) {
          if ((int)uVar6 < 0x280) {
            if ((int)uVar6 < 0x26c) {
              if (uVar6 == 0x25d) {
                sVar12 = BranchLayerParams::ByteSizeLong((this->layer_).branch_);
              }
              else {
                if (uVar6 != 0x267) goto switchD_001ffb71_caseD_33a;
                sVar12 = LoopLayerParams::ByteSizeLong((this->layer_).loop_);
              }
              goto LAB_00200916;
            }
            if ((uVar6 != 0x26c) && (uVar6 != 0x271)) {
              if (uVar6 != 0x27b) goto switchD_001ffb71_caseD_33a;
              pCVar14 = (this->layer_).convolution_;
              uVar16 = (ulong)(-(uint)((float)(pCVar14->kernelsize_).current_size_ != 0.0) & 1);
              piVar1 = &(pCVar14->kernelsize_).total_size_;
              uVar19 = uVar16 * 5 + 5;
              uVar17 = uVar16 * 5;
              if ((float)*piVar1 != 0.0) {
                uVar17 = uVar19;
              }
              if (NAN((float)*piVar1)) {
                uVar17 = uVar19;
              }
              ppRVar2 = &(pCVar14->kernelsize_).rep_;
              uVar16 = uVar17;
              if (*(float *)ppRVar2 != 0.0) {
                uVar16 = uVar17 + 5;
              }
              if (NAN(*(float *)ppRVar2)) {
                uVar16 = uVar17 + 5;
              }
LAB_00200601:
              *(int *)((long)&(pCVar14->kernelsize_).rep_ + 4) = (int)uVar16;
              goto LAB_00200604;
            }
          }
          else {
            if ((int)uVar6 < 0x299) {
              if ((uVar6 != 0x280) && (uVar6 != 0x294)) goto switchD_001ffb71_caseD_33a;
switchD_001ffc56_caseD_5b4:
              pCVar14 = (this->layer_).convolution_;
              piVar1 = &(pCVar14->kernelsize_).total_size_;
              fVar3 = (float)*piVar1;
              fVar4 = (float)*piVar1;
              uVar19 = (ulong)(-(uint)((float)(pCVar14->kernelsize_).current_size_ != 0.0) & 1) * 5;
LAB_002004b2:
              uVar16 = uVar19;
              if (fVar4 != 0.0) {
                uVar16 = uVar19 + 5;
              }
              if (NAN(fVar3)) {
                uVar16 = uVar19 + 5;
              }
              *(int *)&(pCVar14->kernelsize_).rep_ = (int)uVar16;
LAB_00200604:
              sVar13 = sVar13 + uVar16 + 3;
              goto switchD_001ffb71_caseD_33a;
            }
            if (((uVar6 != 0x299) && (uVar6 != 0x29e)) && (uVar6 != 0x2a8))
            goto switchD_001ffb71_caseD_33a;
          }
        }
        else if ((int)uVar6 < 0x2da) {
          if ((int)uVar6 < 0x2c6) {
            if ((uVar6 != 0x2ad) && (uVar6 != 700)) goto switchD_001ffb71_caseD_33a;
          }
          else if ((uVar6 != 0x2c6) && ((uVar6 != 0x2cb && (uVar6 != 0x2d0))))
          goto switchD_001ffb71_caseD_33a;
        }
        else if ((int)uVar6 < 0x2e4) {
          if ((uVar6 != 0x2da) && (uVar6 != 0x2df)) goto switchD_001ffb71_caseD_33a;
        }
        else if ((uVar6 != 0x2e4) && ((uVar6 != 0x2ee && (uVar6 != 0x2f3))))
        goto switchD_001ffb71_caseD_33a;
      }
      else if ((int)uVar6 < 0x339) {
        if ((int)uVar6 < 0x316) {
          if ((int)uVar6 < 0x307) {
            if ((uVar6 != 0x2f8) && (uVar6 != 0x302)) goto switchD_001ffb71_caseD_33a;
          }
          else if ((uVar6 != 0x307) && (uVar6 != 0x30c)) goto switchD_001ffb71_caseD_33a;
        }
        else {
          if (0x32e < (int)uVar6) {
            if ((uVar6 != 0x32f) && (uVar6 != 0x334)) goto switchD_001ffb71_caseD_33a;
            goto switchD_001ffb71_caseD_339;
          }
          if (uVar6 != 0x316) {
            if (uVar6 != 0x31b) goto switchD_001ffb71_caseD_33a;
            goto switchD_001ffcd9_caseD_3b1;
          }
        }
      }
      else if ((int)uVar6 < 0x352) {
        switch(uVar6) {
        case 0x339:
        case 0x33b:
        case 0x33e:
        case 0x340:
          goto switchD_001ffb71_caseD_339;
        case 0x33a:
        case 0x33c:
        case 0x33d:
        case 0x33f:
          goto switchD_001ffb71_caseD_33a;
        default:
          if ((uVar6 != 0x348) && (uVar6 != 0x34d)) goto switchD_001ffb71_caseD_33a;
        }
      }
      else if ((int)uVar6 < 0x361) {
        if ((uVar6 != 0x352) && (uVar6 != 0x357)) goto switchD_001ffb71_caseD_33a;
      }
      else if ((uVar6 != 0x361) && ((uVar6 != 0x366 && (uVar6 != 0x36b))))
      goto switchD_001ffb71_caseD_33a;
      goto LAB_0020061b;
    }
    if ((int)uVar6 < 0xfa) {
      if ((int)uVar6 < 0xbe) {
        if ((int)uVar6 < 0xa0) {
          if ((int)uVar6 < 0x82) {
            if (uVar6 == 100) {
              sVar12 = ConvolutionLayerParams::ByteSizeLong((this->layer_).convolution_);
            }
            else {
              if (uVar6 != 0x78) goto switchD_001ffb71_caseD_33a;
              sVar12 = PoolingLayerParams::ByteSizeLong((this->layer_).pooling_);
            }
          }
          else if (uVar6 == 0x82) {
            sVar12 = ActivationParams::ByteSizeLong((this->layer_).activation_);
          }
          else if (uVar6 == 0x8c) {
            sVar12 = InnerProductLayerParams::ByteSizeLong((this->layer_).innerproduct_);
          }
          else {
            if (uVar6 != 0x96) goto switchD_001ffb71_caseD_33a;
            sVar12 = EmbeddingLayerParams::ByteSizeLong((this->layer_).embedding_);
          }
        }
        else if ((int)uVar6 < 0xaa) {
          if (uVar6 != 0xa0) {
            if (uVar6 != 0xa5) goto switchD_001ffb71_caseD_33a;
            pCVar14 = (this->layer_).convolution_;
            uVar16 = (ulong)((uint)(byte)(pCVar14->kernelsize_).current_size_ * 2);
            uVar19 = uVar16 + 2;
            if (*(char *)((long)&(pCVar14->kernelsize_).current_size_ + 1) == '\0') {
              uVar19 = uVar16;
            }
            piVar1 = &(pCVar14->kernelsize_).total_size_;
            fVar3 = (float)*piVar1;
            fVar4 = (float)*piVar1;
            goto LAB_002004b2;
          }
          sVar12 = BatchnormLayerParams::ByteSizeLong((this->layer_).batchnorm_);
        }
        else {
          if (uVar6 == 0xaa) goto switchD_001ffb71_caseD_339;
          if (uVar6 == 0xaf) goto LAB_0020061b;
          if (uVar6 != 0xb4) goto switchD_001ffb71_caseD_33a;
          sVar12 = LRNLayerParams::ByteSizeLong((this->layer_).lrn_);
        }
      }
      else if ((int)uVar6 < 0xdc) {
        if ((int)uVar6 < 0xd2) {
          if (uVar6 == 0xbe) {
            sVar12 = CropLayerParams::ByteSizeLong((this->layer_).crop_);
          }
          else {
            if (uVar6 != 200) goto switchD_001ffb71_caseD_33a;
            sVar12 = PaddingLayerParams::ByteSizeLong((this->layer_).padding_);
          }
        }
        else if (uVar6 == 0xd2) {
          sVar12 = UpsampleLayerParams::ByteSizeLong((this->layer_).upsample_);
        }
        else if (uVar6 == 0xd3) {
          sVar12 = ResizeBilinearLayerParams::ByteSizeLong((this->layer_).resizebilinear_);
        }
        else {
          if (uVar6 != 0xd4) goto switchD_001ffb71_caseD_33a;
          sVar12 = CropResizeLayerParams::ByteSizeLong((this->layer_).cropresize_);
        }
      }
      else if ((int)uVar6 < 0xe7) {
        if (uVar6 != 0xdc) {
          if (uVar6 != 0xe6) goto switchD_001ffb71_caseD_33a;
          goto switchD_001ffb71_caseD_339;
        }
        sVar12 = UnaryFunctionLayerParams::ByteSizeLong((this->layer_).unary_);
      }
      else {
        if (uVar6 == 0xe7) {
switchD_001ffb71_caseD_339:
          uVar15 = -(uint)((float)(((this->layer_).convolution_)->kernelsize_).current_size_ != 0.0)
                   & 1;
          (((this->layer_).convolution_)->kernelsize_).total_size_ = uVar15 * 5;
          lVar20 = (ulong)uVar15 * 5;
          goto LAB_001ffb94;
        }
        if (uVar6 == 0xf0) goto LAB_0020061b;
        if (uVar6 != 0xf5) goto switchD_001ffb71_caseD_33a;
        sVar12 = ScaleLayerParams::ByteSizeLong((this->layer_).scale_);
      }
    }
    else if ((int)uVar6 < 0x14a) {
      if ((int)uVar6 < 0x122) {
        if ((int)uVar6 < 0x105) {
          if (uVar6 != 0xfa) {
            if (uVar6 != 0x104) goto switchD_001ffb71_caseD_33a;
            goto LAB_0020061b;
          }
          sVar12 = BiasLayerParams::ByteSizeLong((this->layer_).bias_);
        }
        else {
          if (uVar6 == 0x105) goto LAB_0020061b;
          if (uVar6 == 0x10e) {
            uVar15 = (uint)(byte)(((this->layer_).convolution_)->kernelsize_).current_size_ * 2;
            (((this->layer_).convolution_)->kernelsize_).total_size_ = uVar15;
            sVar13 = sVar13 + uVar15 + 3;
            goto switchD_001ffb71_caseD_33a;
          }
          if (uVar6 != 0x118) goto switchD_001ffb71_caseD_33a;
          sVar12 = ReduceLayerParams::ByteSizeLong((this->layer_).reduce_);
        }
      }
      else {
        if (300 < (int)uVar6) {
          if (uVar6 == 0x12d) goto switchD_001ffcd9_caseD_3b1;
          if (uVar6 == 0x136) {
            sVar12 = PermuteLayerParams::ByteSizeLong((this->layer_).permute_);
            goto LAB_00200916;
          }
          if (uVar6 != 0x140) goto switchD_001ffb71_caseD_33a;
          bVar5 = (byte)(((this->layer_).convolution_)->kernelsize_).current_size_;
          (((this->layer_).convolution_)->kernelsize_).total_size_ = (uint)bVar5 + (uint)bVar5 * 2;
          lVar20 = (ulong)bVar5 * 3;
LAB_001ffb94:
          sVar13 = sVar13 + lVar20 + 3;
          goto switchD_001ffb71_caseD_33a;
        }
        if (uVar6 == 0x122) {
          sVar12 = LoadConstantLayerParams::ByteSizeLong((this->layer_).loadconstant_);
        }
        else {
          if (uVar6 != 300) goto switchD_001ffb71_caseD_33a;
          sVar12 = ReshapeLayerParams::ByteSizeLong((this->layer_).reshape_);
        }
      }
    }
    else if ((int)uVar6 < 0x19a) {
      if ((int)uVar6 < 0x159) {
        if ((uVar6 != 0x14a) && (uVar6 != 0x154)) goto switchD_001ffb71_caseD_33a;
        goto switchD_001ffcd9_caseD_3b6;
      }
      if (uVar6 == 0x159) {
        sVar12 = ReorganizeDataLayerParams::ByteSizeLong((this->layer_).reorganizedata_);
      }
      else if (uVar6 == 0x15e) {
        sVar12 = SliceLayerParams::ByteSizeLong((this->layer_).slice_);
      }
      else {
        if (uVar6 != 400) goto switchD_001ffb71_caseD_33a;
        sVar12 = SimpleRecurrentLayerParams::ByteSizeLong((this->layer_).simplerecurrent_);
      }
    }
    else if ((int)uVar6 < 0x1ae) {
      if (uVar6 == 0x19a) {
        sVar12 = GRULayerParams::ByteSizeLong((this->layer_).gru_);
      }
      else {
        if (uVar6 != 0x1a4) goto switchD_001ffb71_caseD_33a;
        sVar12 = UniDirectionalLSTMLayerParams::ByteSizeLong((this->layer_).unidirectionallstm_);
      }
    }
    else if (uVar6 == 0x1ae) {
      sVar12 = BiDirectionalLSTMLayerParams::ByteSizeLong((this->layer_).bidirectionallstm_);
    }
    else {
      if (uVar6 != 500) {
        if (uVar6 != 600) goto switchD_001ffb71_caseD_33a;
        goto LAB_0020061b;
      }
      sVar12 = CustomLayerParams::ByteSizeLong((this->layer_).custom_);
    }
  }
  else if ((int)uVar6 < 0x474) {
    if ((int)uVar6 < 0x3e3) {
      if ((int)uVar6 < 0x3ac) {
        if ((int)uVar6 < 0x389) {
          if ((int)uVar6 < 0x37a) {
            if ((uVar6 != 0x370) && (uVar6 != 0x375)) goto switchD_001ffb71_caseD_33a;
          }
          else if ((uVar6 != 0x37a) && ((uVar6 != 0x37f && (uVar6 != 900))))
          goto switchD_001ffb71_caseD_33a;
          goto LAB_0020061b;
        }
        if ((int)uVar6 < 0x39d) {
          if (uVar6 == 0x389) goto LAB_0020061b;
          if (uVar6 != 0x398) goto switchD_001ffb71_caseD_33a;
          sVar12 = TileLayerParams::ByteSizeLong((this->layer_).tile_);
        }
        else {
          if ((uVar6 == 0x39d) || (uVar6 == 0x3a2)) goto switchD_001ffcd9_caseD_3b6;
          if (uVar6 != 0x3a7) goto switchD_001ffb71_caseD_33a;
          sVar12 = ScatterLayerParams::ByteSizeLong((this->layer_).scatter_);
        }
      }
      else {
        if ((int)uVar6 < 0x3c0) {
          switch(uVar6) {
          case 0x3b1:
switchD_001ffcd9_caseD_3b1:
            uVar15 = (((this->layer_).convolution_)->kernelsize_).current_size_;
            if (uVar15 == 0) {
              uVar19 = 0;
            }
            else if ((int)uVar15 < 0) {
              uVar19 = 0xb;
            }
            else {
              iVar8 = 0x1f;
              if ((uVar15 | 1) != 0) {
                for (; (uVar15 | 1) >> iVar8 == 0; iVar8 = iVar8 + -1) {
                }
              }
              uVar19 = (ulong)((iVar8 * 9 + 0x49U >> 6) + 1);
            }
            (((this->layer_).convolution_)->kernelsize_).total_size_ = (int)uVar19;
            break;
          case 0x3b2:
          case 0x3b3:
          case 0x3b4:
          case 0x3b5:
          case 0x3b7:
          case 0x3b9:
            goto switchD_001ffb71_caseD_33a;
          case 0x3b6:
          case 0x3b8:
switchD_001ffcd9_caseD_3b6:
            pCVar14 = (this->layer_).convolution_;
            uVar16._0_4_ = (pCVar14->kernelsize_).current_size_;
            uVar16._4_4_ = (pCVar14->kernelsize_).total_size_;
            if (uVar16 == 0) {
              uVar19 = 0;
            }
            else {
              lVar20 = 0x3f;
              if ((uVar16 | 1) != 0) {
                for (; (uVar16 | 1) >> lVar20 == 0; lVar20 = lVar20 + -1) {
                }
              }
              uVar19 = (ulong)((int)lVar20 * 9 + 0x49U >> 6) + 1;
            }
            *(int *)&(pCVar14->kernelsize_).rep_ = (int)uVar19;
            break;
          case 0x3ba:
            sVar12 = ScatterAlongAxisLayerParams::ByteSizeLong((this->layer_).scatteralongaxis_);
            goto LAB_00200916;
          default:
            if (uVar6 != 0x3ac) goto switchD_001ffb71_caseD_33a;
            goto LAB_0020061b;
          }
          sVar13 = sVar13 + uVar19 + 3;
          goto switchD_001ffb71_caseD_33a;
        }
        if ((int)uVar6 < 0x3cf) {
          if (uVar6 == 0x3c0) {
            sVar12 = google::protobuf::internal::WireFormatLite::
                     MessageSizeNoVirtual<CoreML::Specification::ReverseLayerParams>
                               ((this->layer_).reverse_);
            goto LAB_00200891;
          }
          if (uVar6 != 0x3c5) goto switchD_001ffb71_caseD_33a;
          sVar12 = ReverseSeqLayerParams::ByteSizeLong((this->layer_).reverseseq_);
        }
        else if (uVar6 == 0x3cf) {
          sVar12 = SplitNDLayerParams::ByteSizeLong((this->layer_).splitnd_);
        }
        else {
          if (uVar6 == 0x3d4) goto switchD_001ffcd9_caseD_3b6;
          if (uVar6 != 0x3d9) goto switchD_001ffb71_caseD_33a;
          sVar12 = TransposeLayerParams::ByteSizeLong((this->layer_).transpose_);
        }
      }
    }
    else {
      if ((int)uVar6 < 0x438) {
        if ((int)uVar6 < 0x401) {
          if ((int)uVar6 < 0x3ed) {
            if (uVar6 == 0x3e3) {
              sVar12 = SliceStaticLayerParams::ByteSizeLong((this->layer_).slicestatic_);
            }
            else {
              if (uVar6 != 1000) goto switchD_001ffb71_caseD_33a;
              sVar12 = SliceDynamicLayerParams::ByteSizeLong((this->layer_).slicedynamic_);
            }
          }
          else if (uVar6 == 0x3ed) {
            sVar12 = SlidingWindowsLayerParams::ByteSizeLong((this->layer_).slidingwindows_);
          }
          else {
            if (uVar6 != 0x3f7) {
              if (uVar6 != 0x3fc) goto switchD_001ffb71_caseD_33a;
              goto switchD_001ffc56_caseD_5b5;
            }
            sVar12 = TopKLayerParams::ByteSizeLong((this->layer_).topk_);
          }
        }
        else if ((int)uVar6 < 0x415) {
          if (uVar6 == 0x401) {
switchD_001ffc56_caseD_5b5:
            pCVar14 = (this->layer_).convolution_;
            uVar19._0_4_ = (pCVar14->kernelsize_).current_size_;
            uVar19._4_4_ = (pCVar14->kernelsize_).total_size_;
            if (uVar19 == 0) {
              uVar19 = 0;
            }
            else {
              lVar20 = 0x3f;
              if ((uVar19 | 1) != 0) {
                for (; (uVar19 | 1) >> lVar20 == 0; lVar20 = lVar20 + -1) {
                }
              }
              uVar19 = (ulong)((int)lVar20 * 9 + 0x49U >> 6) + 1;
            }
            uVar16 = uVar19 + 2;
            if (*(char *)&(pCVar14->kernelsize_).rep_ == '\0') {
              uVar16 = uVar19;
            }
            goto LAB_00200601;
          }
          if (uVar6 != 0x410) goto switchD_001ffb71_caseD_33a;
          sVar12 = EmbeddingNDLayerParams::ByteSizeLong((this->layer_).embeddingnd_);
        }
        else if (uVar6 == 0x415) {
          sVar12 = BatchedMatMulLayerParams::ByteSizeLong((this->layer_).batchedmatmul_);
        }
        else {
          if (uVar6 == 0x429) goto LAB_0020061b;
          if (uVar6 != 0x42e) goto switchD_001ffb71_caseD_33a;
          sVar12 = LoadConstantNDLayerParams::ByteSizeLong((this->layer_).loadconstantnd_);
        }
        goto LAB_00200916;
      }
      if ((int)uVar6 < 0x456) {
        if ((int)uVar6 < 0x442) {
          if (uVar6 == 0x438) goto switchD_001ffb71_caseD_339;
          if (uVar6 != 0x43d) goto switchD_001ffb71_caseD_33a;
          sVar12 = FillStaticLayerParams::ByteSizeLong((this->layer_).fillstatic_);
        }
        else {
          if (uVar6 == 0x442) goto switchD_001ffb71_caseD_339;
          if (uVar6 == 0x44c) goto LAB_0020061b;
          if (uVar6 != 0x451) goto switchD_001ffb71_caseD_33a;
          sVar12 = BroadcastToStaticLayerParams::ByteSizeLong((this->layer_).broadcasttostatic_);
        }
      }
      else if ((int)uVar6 < 0x465) {
        if (uVar6 == 0x456) goto LAB_0020061b;
        if (uVar6 != 0x460) goto switchD_001ffb71_caseD_33a;
        sVar12 = SqueezeLayerParams::ByteSizeLong((this->layer_).squeeze_);
      }
      else {
        if (uVar6 != 0x465) {
          if (uVar6 == 0x46a) goto switchD_001ffcd9_caseD_3b6;
          if (uVar6 != 0x46f) goto switchD_001ffb71_caseD_33a;
          goto LAB_0020061b;
        }
        sVar12 = ExpandDimsLayerParams::ByteSizeLong((this->layer_).expanddims_);
      }
    }
  }
  else if ((int)uVar6 < 0x4fb) {
    if ((int)uVar6 < 0x4b0) {
      if ((int)uVar6 < 0x492) {
        if ((int)uVar6 < 0x47e) {
          if (uVar6 != 0x474) {
            if (uVar6 != 0x479) goto switchD_001ffb71_caseD_33a;
            goto LAB_0020061b;
          }
          sVar12 = ReshapeStaticLayerParams::ByteSizeLong((this->layer_).reshapestatic_);
        }
        else if (uVar6 == 0x47e) {
          sVar12 = RankPreservingReshapeLayerParams::ByteSizeLong
                             ((this->layer_).rankpreservingreshape_);
        }
        else {
          if (uVar6 != 0x483) goto switchD_001ffb71_caseD_33a;
          sVar12 = ConstantPaddingLayerParams::ByteSizeLong((this->layer_).constantpad_);
        }
      }
      else if ((int)uVar6 < 0x49c) {
        if (uVar6 == 0x492) {
          sVar12 = RandomNormalLikeLayerParams::ByteSizeLong((this->layer_).randomnormallike_);
        }
        else {
          if (uVar6 != 0x497) goto switchD_001ffb71_caseD_33a;
          sVar12 = RandomNormalStaticLayerParams::ByteSizeLong((this->layer_).randomnormalstatic_);
        }
      }
      else if (uVar6 == 0x49c) {
        sVar12 = RandomNormalDynamicLayerParams::ByteSizeLong((this->layer_).randomnormaldynamic_);
      }
      else if (uVar6 == 0x4a6) {
        sVar12 = RandomUniformLikeLayerParams::ByteSizeLong((this->layer_).randomuniformlike_);
      }
      else {
        if (uVar6 != 0x4ab) goto switchD_001ffb71_caseD_33a;
        sVar12 = RandomUniformStaticLayerParams::ByteSizeLong((this->layer_).randomuniformstatic_);
      }
    }
    else if ((int)uVar6 < 0x4e2) {
      if ((int)uVar6 < 0x4bf) {
        if (uVar6 != 0x4b0) {
          if (uVar6 != 0x4ba) goto switchD_001ffb71_caseD_33a;
          sVar12 = google::protobuf::internal::WireFormatLite::
                   MessageSizeNoVirtual<CoreML::Specification::RandomBernoulliLikeLayerParams>
                             ((this->layer_).randombernoullilike_);
LAB_00200891:
          sVar13 = sVar13 + sVar12 + 2;
          goto switchD_001ffb71_caseD_33a;
        }
        sVar12 = RandomUniformDynamicLayerParams::ByteSizeLong((this->layer_).randomuniformdynamic_)
        ;
      }
      else if (uVar6 == 0x4bf) {
        sVar12 = RandomBernoulliStaticLayerParams::ByteSizeLong
                           ((this->layer_).randombernoullistatic_);
      }
      else {
        if (uVar6 == 0x4c4) {
          sVar12 = google::protobuf::internal::WireFormatLite::
                   MessageSizeNoVirtual<CoreML::Specification::RandomBernoulliDynamicLayerParams>
                             ((this->layer_).randombernoullidynamic_);
          goto LAB_00200891;
        }
        if (uVar6 != 0x4ce) goto switchD_001ffb71_caseD_33a;
        sVar12 = CategoricalDistributionLayerParams::ByteSizeLong
                           ((this->layer_).categoricaldistribution_);
      }
    }
    else if ((int)uVar6 < 0x4ec) {
      if (uVar6 == 0x4e2) {
        sVar12 = ReduceL1LayerParams::ByteSizeLong((this->layer_).reducel1_);
      }
      else {
        if (uVar6 != 0x4e7) goto switchD_001ffb71_caseD_33a;
        sVar12 = ReduceL2LayerParams::ByteSizeLong((this->layer_).reducel2_);
      }
    }
    else if (uVar6 == 0x4ec) {
      sVar12 = ReduceMaxLayerParams::ByteSizeLong((this->layer_).reducemax_);
    }
    else if (uVar6 == 0x4f1) {
      sVar12 = ReduceMinLayerParams::ByteSizeLong((this->layer_).reducemin_);
    }
    else {
      if (uVar6 != 0x4f6) goto switchD_001ffb71_caseD_33a;
      sVar12 = ReduceSumLayerParams::ByteSizeLong((this->layer_).reducesum_);
    }
  }
  else if ((int)uVar6 < 0x546) {
    if (0x520 < (int)uVar6) {
      if ((int)uVar6 < 0x528) {
        if (uVar6 != 0x521) {
          if (uVar6 != 0x523) goto switchD_001ffb71_caseD_33a;
          sVar12 = MatrixBandPartLayerParams::ByteSizeLong((this->layer_).matrixbandpart_);
          goto LAB_00200916;
        }
      }
      else {
        if ((uVar6 == 0x528) || (uVar6 == 0x52d)) goto switchD_001ffcd9_caseD_3b6;
        if (uVar6 != 0x532) goto switchD_001ffb71_caseD_33a;
      }
LAB_0020061b:
      (((this->layer_).convolution_)->kernelsize_).current_size_ = 0;
      sVar13 = sVar13 + 3;
      goto switchD_001ffb71_caseD_33a;
    }
    if ((int)uVar6 < 0x505) {
      if (uVar6 == 0x4fb) {
        sVar12 = ReduceProdLayerParams::ByteSizeLong((this->layer_).reduceprod_);
      }
      else {
        if (uVar6 != 0x500) goto switchD_001ffb71_caseD_33a;
        sVar12 = ReduceMeanLayerParams::ByteSizeLong((this->layer_).reducemean_);
      }
    }
    else if (uVar6 == 0x505) {
      sVar12 = ReduceLogSumLayerParams::ByteSizeLong((this->layer_).reducelogsum_);
    }
    else if (uVar6 == 0x50a) {
      sVar12 = ReduceSumSquareLayerParams::ByteSizeLong((this->layer_).reducesumsquare_);
    }
    else {
      if (uVar6 != 0x50f) goto switchD_001ffb71_caseD_33a;
      sVar12 = ReduceLogSumExpLayerParams::ByteSizeLong((this->layer_).reducelogsumexp_);
    }
  }
  else if ((int)uVar6 < 0x5af) {
    if (uVar6 == 0x546) {
      sVar12 = LayerNormalizationLayerParams::ByteSizeLong((this->layer_).layernormalization_);
    }
    else if (uVar6 == 0x578) {
      sVar12 = NonMaximumSuppressionLayerParams::ByteSizeLong((this->layer_).nonmaximumsuppression_)
      ;
    }
    else {
      if (uVar6 != 0x5aa) goto switchD_001ffb71_caseD_33a;
      sVar12 = OneHotLayerParams::ByteSizeLong((this->layer_).onehot_);
    }
  }
  else {
    switch(uVar6) {
    case 0x5af:
      sVar12 = CumSumLayerParams::ByteSizeLong((this->layer_).cumsum_);
      break;
    default:
      goto switchD_001ffb71_caseD_33a;
    case 0x5b4:
      goto switchD_001ffc56_caseD_5b4;
    case 0x5b5:
      goto switchD_001ffc56_caseD_5b5;
    case 0x5b9:
      sVar12 = Pooling3DLayerParams::ByteSizeLong((this->layer_).pooling3d_);
      break;
    case 0x5ba:
      goto switchD_001ffcd9_caseD_3b1;
    case 0x5be:
      sVar12 = SliceBySizeLayerParams::ByteSizeLong((this->layer_).slicebysize_);
      break;
    case 0x5bf:
      sVar12 = Convolution3DLayerParams::ByteSizeLong((this->layer_).convolution3d_);
    }
  }
LAB_00200916:
  uVar15 = (uint)sVar12 | 1;
  iVar8 = 0x1f;
  if (uVar15 != 0) {
    for (; uVar15 >> iVar8 == 0; iVar8 = iVar8 + -1) {
    }
  }
  sVar13 = sVar13 + sVar12 + (ulong)(iVar8 * 9 + 0x49U >> 6) + 2;
switchD_001ffb71_caseD_33a:
  this->_cached_size_ = (int)sVar13;
  return sVar13;
}

Assistant:

size_t NeuralNetworkLayer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetworkLayer)
  size_t total_size = 0;

  // repeated string input = 2;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->input_size());
  for (int i = 0, n = this->input_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->input(i));
  }

  // repeated string output = 3;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->output_size());
  for (int i = 0, n = this->output_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->output(i));
  }

  // repeated .CoreML.Specification.Tensor inputTensor = 4;
  {
    unsigned int count = this->inputtensor_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->inputtensor(i));
    }
  }

  // repeated .CoreML.Specification.Tensor outputTensor = 5;
  {
    unsigned int count = this->outputtensor_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->outputtensor(i));
    }
  }

  // string name = 1;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->name());
  }

  // bool isUpdatable = 10;
  if (this->isupdatable() != 0) {
    total_size += 1 + 1;
  }

  switch (layer_case()) {
    // .CoreML.Specification.ConvolutionLayerParams convolution = 100;
    case kConvolution: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.convolution_);
      break;
    }
    // .CoreML.Specification.PoolingLayerParams pooling = 120;
    case kPooling: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.pooling_);
      break;
    }
    // .CoreML.Specification.ActivationParams activation = 130;
    case kActivation: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.activation_);
      break;
    }
    // .CoreML.Specification.InnerProductLayerParams innerProduct = 140;
    case kInnerProduct: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.innerproduct_);
      break;
    }
    // .CoreML.Specification.EmbeddingLayerParams embedding = 150;
    case kEmbedding: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.embedding_);
      break;
    }
    // .CoreML.Specification.BatchnormLayerParams batchnorm = 160;
    case kBatchnorm: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.batchnorm_);
      break;
    }
    // .CoreML.Specification.MeanVarianceNormalizeLayerParams mvn = 165;
    case kMvn: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.mvn_);
      break;
    }
    // .CoreML.Specification.L2NormalizeLayerParams l2normalize = 170;
    case kL2Normalize: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.l2normalize_);
      break;
    }
    // .CoreML.Specification.SoftmaxLayerParams softmax = 175;
    case kSoftmax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.softmax_);
      break;
    }
    // .CoreML.Specification.LRNLayerParams lrn = 180;
    case kLrn: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lrn_);
      break;
    }
    // .CoreML.Specification.CropLayerParams crop = 190;
    case kCrop: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.crop_);
      break;
    }
    // .CoreML.Specification.PaddingLayerParams padding = 200;
    case kPadding: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.padding_);
      break;
    }
    // .CoreML.Specification.UpsampleLayerParams upsample = 210;
    case kUpsample: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.upsample_);
      break;
    }
    // .CoreML.Specification.ResizeBilinearLayerParams resizeBilinear = 211;
    case kResizeBilinear: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.resizebilinear_);
      break;
    }
    // .CoreML.Specification.CropResizeLayerParams cropResize = 212;
    case kCropResize: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cropresize_);
      break;
    }
    // .CoreML.Specification.UnaryFunctionLayerParams unary = 220;
    case kUnary: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.unary_);
      break;
    }
    // .CoreML.Specification.AddLayerParams add = 230;
    case kAdd: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.add_);
      break;
    }
    // .CoreML.Specification.MultiplyLayerParams multiply = 231;
    case kMultiply: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.multiply_);
      break;
    }
    // .CoreML.Specification.AverageLayerParams average = 240;
    case kAverage: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.average_);
      break;
    }
    // .CoreML.Specification.ScaleLayerParams scale = 245;
    case kScale: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scale_);
      break;
    }
    // .CoreML.Specification.BiasLayerParams bias = 250;
    case kBias: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.bias_);
      break;
    }
    // .CoreML.Specification.MaxLayerParams max = 260;
    case kMax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.max_);
      break;
    }
    // .CoreML.Specification.MinLayerParams min = 261;
    case kMin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.min_);
      break;
    }
    // .CoreML.Specification.DotProductLayerParams dot = 270;
    case kDot: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.dot_);
      break;
    }
    // .CoreML.Specification.ReduceLayerParams reduce = 280;
    case kReduce: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reduce_);
      break;
    }
    // .CoreML.Specification.LoadConstantLayerParams loadConstant = 290;
    case kLoadConstant: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loadconstant_);
      break;
    }
    // .CoreML.Specification.ReshapeLayerParams reshape = 300;
    case kReshape: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshape_);
      break;
    }
    // .CoreML.Specification.FlattenLayerParams flatten = 301;
    case kFlatten: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.flatten_);
      break;
    }
    // .CoreML.Specification.PermuteLayerParams permute = 310;
    case kPermute: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.permute_);
      break;
    }
    // .CoreML.Specification.ConcatLayerParams concat = 320;
    case kConcat: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.concat_);
      break;
    }
    // .CoreML.Specification.SplitLayerParams split = 330;
    case kSplit: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.split_);
      break;
    }
    // .CoreML.Specification.SequenceRepeatLayerParams sequenceRepeat = 340;
    case kSequenceRepeat: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sequencerepeat_);
      break;
    }
    // .CoreML.Specification.ReorganizeDataLayerParams reorganizeData = 345;
    case kReorganizeData: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reorganizedata_);
      break;
    }
    // .CoreML.Specification.SliceLayerParams slice = 350;
    case kSlice: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slice_);
      break;
    }
    // .CoreML.Specification.SimpleRecurrentLayerParams simpleRecurrent = 400;
    case kSimpleRecurrent: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.simplerecurrent_);
      break;
    }
    // .CoreML.Specification.GRULayerParams gru = 410;
    case kGru: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gru_);
      break;
    }
    // .CoreML.Specification.UniDirectionalLSTMLayerParams uniDirectionalLSTM = 420;
    case kUniDirectionalLSTM: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.unidirectionallstm_);
      break;
    }
    // .CoreML.Specification.BiDirectionalLSTMLayerParams biDirectionalLSTM = 430;
    case kBiDirectionalLSTM: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.bidirectionallstm_);
      break;
    }
    // .CoreML.Specification.CustomLayerParams custom = 500;
    case kCustom: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.custom_);
      break;
    }
    // .CoreML.Specification.CopyLayerParams copy = 600;
    case kCopy: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.copy_);
      break;
    }
    // .CoreML.Specification.BranchLayerParams branch = 605;
    case kBranch: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.branch_);
      break;
    }
    // .CoreML.Specification.LoopLayerParams loop = 615;
    case kLoop: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loop_);
      break;
    }
    // .CoreML.Specification.LoopBreakLayerParams loopBreak = 620;
    case kLoopBreak: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loopbreak_);
      break;
    }
    // .CoreML.Specification.LoopContinueLayerParams loopContinue = 625;
    case kLoopContinue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loopcontinue_);
      break;
    }
    // .CoreML.Specification.RangeStaticLayerParams rangeStatic = 635;
    case kRangeStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.rangestatic_);
      break;
    }
    // .CoreML.Specification.RangeDynamicLayerParams rangeDynamic = 640;
    case kRangeDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.rangedynamic_);
      break;
    }
    // .CoreML.Specification.ClipLayerParams clip = 660;
    case kClip: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.clip_);
      break;
    }
    // .CoreML.Specification.CeilLayerParams ceil = 665;
    case kCeil: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.ceil_);
      break;
    }
    // .CoreML.Specification.FloorLayerParams floor = 670;
    case kFloor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.floor_);
      break;
    }
    // .CoreML.Specification.SignLayerParams sign = 680;
    case kSign: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sign_);
      break;
    }
    // .CoreML.Specification.RoundLayerParams round = 685;
    case kRound: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.round_);
      break;
    }
    // .CoreML.Specification.Exp2LayerParams exp2 = 700;
    case kExp2: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.exp2_);
      break;
    }
    // .CoreML.Specification.SinLayerParams sin = 710;
    case kSin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sin_);
      break;
    }
    // .CoreML.Specification.CosLayerParams cos = 715;
    case kCos: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cos_);
      break;
    }
    // .CoreML.Specification.TanLayerParams tan = 720;
    case kTan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.tan_);
      break;
    }
    // .CoreML.Specification.AsinLayerParams asin = 730;
    case kAsin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.asin_);
      break;
    }
    // .CoreML.Specification.AcosLayerParams acos = 735;
    case kAcos: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.acos_);
      break;
    }
    // .CoreML.Specification.AtanLayerParams atan = 740;
    case kAtan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.atan_);
      break;
    }
    // .CoreML.Specification.SinhLayerParams sinh = 750;
    case kSinh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.sinh_);
      break;
    }
    // .CoreML.Specification.CoshLayerParams cosh = 755;
    case kCosh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cosh_);
      break;
    }
    // .CoreML.Specification.TanhLayerParams tanh = 760;
    case kTanh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.tanh_);
      break;
    }
    // .CoreML.Specification.AsinhLayerParams asinh = 770;
    case kAsinh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.asinh_);
      break;
    }
    // .CoreML.Specification.AcoshLayerParams acosh = 775;
    case kAcosh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.acosh_);
      break;
    }
    // .CoreML.Specification.AtanhLayerParams atanh = 780;
    case kAtanh: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.atanh_);
      break;
    }
    // .CoreML.Specification.ErfLayerParams erf = 790;
    case kErf: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.erf_);
      break;
    }
    // .CoreML.Specification.GeluLayerParams gelu = 795;
    case kGelu: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gelu_);
      break;
    }
    // .CoreML.Specification.EqualLayerParams equal = 815;
    case kEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.equal_);
      break;
    }
    // .CoreML.Specification.NotEqualLayerParams notEqual = 820;
    case kNotEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.notequal_);
      break;
    }
    // .CoreML.Specification.LessThanLayerParams lessThan = 825;
    case kLessThan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lessthan_);
      break;
    }
    // .CoreML.Specification.LessEqualLayerParams lessEqual = 827;
    case kLessEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lessequal_);
      break;
    }
    // .CoreML.Specification.GreaterThanLayerParams greaterThan = 830;
    case kGreaterThan: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.greaterthan_);
      break;
    }
    // .CoreML.Specification.GreaterEqualLayerParams greaterEqual = 832;
    case kGreaterEqual: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.greaterequal_);
      break;
    }
    // .CoreML.Specification.LogicalOrLayerParams logicalOr = 840;
    case kLogicalOr: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicalor_);
      break;
    }
    // .CoreML.Specification.LogicalXorLayerParams logicalXor = 845;
    case kLogicalXor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicalxor_);
      break;
    }
    // .CoreML.Specification.LogicalNotLayerParams logicalNot = 850;
    case kLogicalNot: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicalnot_);
      break;
    }
    // .CoreML.Specification.LogicalAndLayerParams logicalAnd = 855;
    case kLogicalAnd: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.logicaland_);
      break;
    }
    // .CoreML.Specification.ModBroadcastableLayerParams modBroadcastable = 865;
    case kModBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.modbroadcastable_);
      break;
    }
    // .CoreML.Specification.MinBroadcastableLayerParams minBroadcastable = 870;
    case kMinBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.minbroadcastable_);
      break;
    }
    // .CoreML.Specification.MaxBroadcastableLayerParams maxBroadcastable = 875;
    case kMaxBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.maxbroadcastable_);
      break;
    }
    // .CoreML.Specification.AddBroadcastableLayerParams addBroadcastable = 880;
    case kAddBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.addbroadcastable_);
      break;
    }
    // .CoreML.Specification.PowBroadcastableLayerParams powBroadcastable = 885;
    case kPowBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.powbroadcastable_);
      break;
    }
    // .CoreML.Specification.DivideBroadcastableLayerParams divideBroadcastable = 890;
    case kDivideBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.dividebroadcastable_);
      break;
    }
    // .CoreML.Specification.FloorDivBroadcastableLayerParams floorDivBroadcastable = 895;
    case kFloorDivBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.floordivbroadcastable_);
      break;
    }
    // .CoreML.Specification.MultiplyBroadcastableLayerParams multiplyBroadcastable = 900;
    case kMultiplyBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.multiplybroadcastable_);
      break;
    }
    // .CoreML.Specification.SubtractBroadcastableLayerParams subtractBroadcastable = 905;
    case kSubtractBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.subtractbroadcastable_);
      break;
    }
    // .CoreML.Specification.TileLayerParams tile = 920;
    case kTile: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.tile_);
      break;
    }
    // .CoreML.Specification.StackLayerParams stack = 925;
    case kStack: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.stack_);
      break;
    }
    // .CoreML.Specification.GatherLayerParams gather = 930;
    case kGather: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gather_);
      break;
    }
    // .CoreML.Specification.ScatterLayerParams scatter = 935;
    case kScatter: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scatter_);
      break;
    }
    // .CoreML.Specification.GatherNDLayerParams gatherND = 940;
    case kGatherND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gathernd_);
      break;
    }
    // .CoreML.Specification.ScatterNDLayerParams scatterND = 945;
    case kScatterND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scatternd_);
      break;
    }
    // .CoreML.Specification.SoftmaxNDLayerParams softmaxND = 950;
    case kSoftmaxND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.softmaxnd_);
      break;
    }
    // .CoreML.Specification.GatherAlongAxisLayerParams gatherAlongAxis = 952;
    case kGatherAlongAxis: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.gatheralongaxis_);
      break;
    }
    // .CoreML.Specification.ScatterAlongAxisLayerParams scatterAlongAxis = 954;
    case kScatterAlongAxis: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.scatteralongaxis_);
      break;
    }
    // .CoreML.Specification.ReverseLayerParams reverse = 960;
    case kReverse: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reverse_);
      break;
    }
    // .CoreML.Specification.ReverseSeqLayerParams reverseSeq = 965;
    case kReverseSeq: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reverseseq_);
      break;
    }
    // .CoreML.Specification.SplitNDLayerParams splitND = 975;
    case kSplitND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.splitnd_);
      break;
    }
    // .CoreML.Specification.ConcatNDLayerParams concatND = 980;
    case kConcatND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.concatnd_);
      break;
    }
    // .CoreML.Specification.TransposeLayerParams transpose = 985;
    case kTranspose: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.transpose_);
      break;
    }
    // .CoreML.Specification.SliceStaticLayerParams sliceStatic = 995;
    case kSliceStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slicestatic_);
      break;
    }
    // .CoreML.Specification.SliceDynamicLayerParams sliceDynamic = 1000;
    case kSliceDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slicedynamic_);
      break;
    }
    // .CoreML.Specification.SlidingWindowsLayerParams slidingWindows = 1005;
    case kSlidingWindows: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slidingwindows_);
      break;
    }
    // .CoreML.Specification.TopKLayerParams topK = 1015;
    case kTopK: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.topk_);
      break;
    }
    // .CoreML.Specification.ArgMinLayerParams argMin = 1020;
    case kArgMin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.argmin_);
      break;
    }
    // .CoreML.Specification.ArgMaxLayerParams argMax = 1025;
    case kArgMax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.argmax_);
      break;
    }
    // .CoreML.Specification.EmbeddingNDLayerParams embeddingND = 1040;
    case kEmbeddingND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.embeddingnd_);
      break;
    }
    // .CoreML.Specification.BatchedMatMulLayerParams batchedMatmul = 1045;
    case kBatchedMatmul: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.batchedmatmul_);
      break;
    }
    // .CoreML.Specification.GetShapeLayerParams getShape = 1065;
    case kGetShape: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.getshape_);
      break;
    }
    // .CoreML.Specification.LoadConstantNDLayerParams loadConstantND = 1070;
    case kLoadConstantND: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.loadconstantnd_);
      break;
    }
    // .CoreML.Specification.FillLikeLayerParams fillLike = 1080;
    case kFillLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.filllike_);
      break;
    }
    // .CoreML.Specification.FillStaticLayerParams fillStatic = 1085;
    case kFillStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.fillstatic_);
      break;
    }
    // .CoreML.Specification.FillDynamicLayerParams fillDynamic = 1090;
    case kFillDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.filldynamic_);
      break;
    }
    // .CoreML.Specification.BroadcastToLikeLayerParams broadcastToLike = 1100;
    case kBroadcastToLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.broadcasttolike_);
      break;
    }
    // .CoreML.Specification.BroadcastToStaticLayerParams broadcastToStatic = 1105;
    case kBroadcastToStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.broadcasttostatic_);
      break;
    }
    // .CoreML.Specification.BroadcastToDynamicLayerParams broadcastToDynamic = 1110;
    case kBroadcastToDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.broadcasttodynamic_);
      break;
    }
    // .CoreML.Specification.SqueezeLayerParams squeeze = 1120;
    case kSqueeze: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.squeeze_);
      break;
    }
    // .CoreML.Specification.ExpandDimsLayerParams expandDims = 1125;
    case kExpandDims: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.expanddims_);
      break;
    }
    // .CoreML.Specification.FlattenTo2DLayerParams flattenTo2D = 1130;
    case kFlattenTo2D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.flattento2d_);
      break;
    }
    // .CoreML.Specification.ReshapeLikeLayerParams reshapeLike = 1135;
    case kReshapeLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshapelike_);
      break;
    }
    // .CoreML.Specification.ReshapeStaticLayerParams reshapeStatic = 1140;
    case kReshapeStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshapestatic_);
      break;
    }
    // .CoreML.Specification.ReshapeDynamicLayerParams reshapeDynamic = 1145;
    case kReshapeDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reshapedynamic_);
      break;
    }
    // .CoreML.Specification.RankPreservingReshapeLayerParams rankPreservingReshape = 1150;
    case kRankPreservingReshape: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.rankpreservingreshape_);
      break;
    }
    // .CoreML.Specification.ConstantPaddingLayerParams constantPad = 1155;
    case kConstantPad: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.constantpad_);
      break;
    }
    // .CoreML.Specification.RandomNormalLikeLayerParams randomNormalLike = 1170;
    case kRandomNormalLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomnormallike_);
      break;
    }
    // .CoreML.Specification.RandomNormalStaticLayerParams randomNormalStatic = 1175;
    case kRandomNormalStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomnormalstatic_);
      break;
    }
    // .CoreML.Specification.RandomNormalDynamicLayerParams randomNormalDynamic = 1180;
    case kRandomNormalDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomnormaldynamic_);
      break;
    }
    // .CoreML.Specification.RandomUniformLikeLayerParams randomUniformLike = 1190;
    case kRandomUniformLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomuniformlike_);
      break;
    }
    // .CoreML.Specification.RandomUniformStaticLayerParams randomUniformStatic = 1195;
    case kRandomUniformStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomuniformstatic_);
      break;
    }
    // .CoreML.Specification.RandomUniformDynamicLayerParams randomUniformDynamic = 1200;
    case kRandomUniformDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randomuniformdynamic_);
      break;
    }
    // .CoreML.Specification.RandomBernoulliLikeLayerParams randomBernoulliLike = 1210;
    case kRandomBernoulliLike: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randombernoullilike_);
      break;
    }
    // .CoreML.Specification.RandomBernoulliStaticLayerParams randomBernoulliStatic = 1215;
    case kRandomBernoulliStatic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randombernoullistatic_);
      break;
    }
    // .CoreML.Specification.RandomBernoulliDynamicLayerParams randomBernoulliDynamic = 1220;
    case kRandomBernoulliDynamic: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.randombernoullidynamic_);
      break;
    }
    // .CoreML.Specification.CategoricalDistributionLayerParams categoricalDistribution = 1230;
    case kCategoricalDistribution: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.categoricaldistribution_);
      break;
    }
    // .CoreML.Specification.ReduceL1LayerParams reduceL1 = 1250;
    case kReduceL1: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducel1_);
      break;
    }
    // .CoreML.Specification.ReduceL2LayerParams reduceL2 = 1255;
    case kReduceL2: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducel2_);
      break;
    }
    // .CoreML.Specification.ReduceMaxLayerParams reduceMax = 1260;
    case kReduceMax: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducemax_);
      break;
    }
    // .CoreML.Specification.ReduceMinLayerParams reduceMin = 1265;
    case kReduceMin: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducemin_);
      break;
    }
    // .CoreML.Specification.ReduceSumLayerParams reduceSum = 1270;
    case kReduceSum: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducesum_);
      break;
    }
    // .CoreML.Specification.ReduceProdLayerParams reduceProd = 1275;
    case kReduceProd: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reduceprod_);
      break;
    }
    // .CoreML.Specification.ReduceMeanLayerParams reduceMean = 1280;
    case kReduceMean: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducemean_);
      break;
    }
    // .CoreML.Specification.ReduceLogSumLayerParams reduceLogSum = 1285;
    case kReduceLogSum: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducelogsum_);
      break;
    }
    // .CoreML.Specification.ReduceSumSquareLayerParams reduceSumSquare = 1290;
    case kReduceSumSquare: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducesumsquare_);
      break;
    }
    // .CoreML.Specification.ReduceLogSumExpLayerParams reduceLogSumExp = 1295;
    case kReduceLogSumExp: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.reducelogsumexp_);
      break;
    }
    // .CoreML.Specification.WhereNonZeroLayerParams whereNonZero = 1313;
    case kWhereNonZero: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.wherenonzero_);
      break;
    }
    // .CoreML.Specification.MatrixBandPartLayerParams matrixBandPart = 1315;
    case kMatrixBandPart: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.matrixbandpart_);
      break;
    }
    // .CoreML.Specification.LowerTriangularLayerParams lowerTriangular = 1320;
    case kLowerTriangular: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.lowertriangular_);
      break;
    }
    // .CoreML.Specification.UpperTriangularLayerParams upperTriangular = 1325;
    case kUpperTriangular: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.uppertriangular_);
      break;
    }
    // .CoreML.Specification.WhereBroadcastableLayerParams whereBroadcastable = 1330;
    case kWhereBroadcastable: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.wherebroadcastable_);
      break;
    }
    // .CoreML.Specification.LayerNormalizationLayerParams layerNormalization = 1350;
    case kLayerNormalization: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.layernormalization_);
      break;
    }
    // .CoreML.Specification.NonMaximumSuppressionLayerParams NonMaximumSuppression = 1400;
    case kNonMaximumSuppression: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.nonmaximumsuppression_);
      break;
    }
    // .CoreML.Specification.OneHotLayerParams oneHot = 1450;
    case kOneHot: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.onehot_);
      break;
    }
    // .CoreML.Specification.CumSumLayerParams cumSum = 1455;
    case kCumSum: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.cumsum_);
      break;
    }
    // .CoreML.Specification.ClampedReLULayerParams clampedReLU = 1460;
    case kClampedReLU: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.clampedrelu_);
      break;
    }
    // .CoreML.Specification.ArgSortLayerParams argSort = 1461;
    case kArgSort: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.argsort_);
      break;
    }
    // .CoreML.Specification.Pooling3DLayerParams pooling3d = 1465;
    case kPooling3D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.pooling3d_);
      break;
    }
    // .CoreML.Specification.GlobalPooling3DLayerParams globalPooling3d = 1466;
    case kGlobalPooling3D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.globalpooling3d_);
      break;
    }
    // .CoreML.Specification.SliceBySizeLayerParams sliceBySize = 1470;
    case kSliceBySize: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.slicebysize_);
      break;
    }
    // .CoreML.Specification.Convolution3DLayerParams convolution3d = 1471;
    case kConvolution3D: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *layer_.convolution3d_);
      break;
    }
    case LAYER_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}